

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O1

void __thiscall kratos::StubGeneratorVisitor::visit(StubGeneratorVisitor *this,Generator *generator)

{
  _func_int **pp_Var1;
  undefined1 var [8];
  pointer this_00;
  int iVar2;
  uint32_t width;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Base_ptr p_Var3;
  VarException *pVVar4;
  runtime_error *this_01;
  GeneratorException *this_02;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  initializer_list<kratos::IRNode_*> __l_01;
  undefined1 local_f0 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ports;
  undefined1 local_b0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vars;
  string local_88;
  undefined1 local_68 [8];
  shared_ptr<kratos::Port> port;
  pointer ppStack_50;
  allocator_type local_31;
  
  if (generator->is_stub_ == true) {
    if ((generator->stmts_).
        super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (generator->stmts_).
        super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)
               &port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)local_f0,(detail *)"{0} is marked as a stub but contains statements",
                 (string_view)ZEXT816(0x2f),args_01);
      std::runtime_error::runtime_error(this_01,(string *)local_f0);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    Generator::get_vars_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_b0,generator);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_f0,&(generator->ports_)._M_t);
    if (local_b0 !=
        (undefined1  [8])
        vars.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      this_02 = (GeneratorException *)__cxa_allocate_exception(0x10);
      local_88._M_dataplus._M_p = (generator->name)._M_dataplus._M_p;
      local_88._M_string_length = (generator->name)._M_string_length;
      format_str_01.size_ = 0xd;
      format_str_01.data_ = (char *)0x32;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_88;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)
                 &port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (detail *)"{0} is declared as stub but has declared variables",format_str_01,
                 args_02);
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)local_68;
      local_68 = (undefined1  [8])generator;
      std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)&local_88,__l_01,
                 (allocator_type *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count);
      GeneratorException::GeneratorException
                (this_02,(string *)
                         &port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,
                 (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)&local_88);
      __cxa_throw(this_02,&GeneratorException::typeinfo,std::runtime_error::~runtime_error);
    }
    if (ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Rb_tree_node_base *)&ports
       ) {
      p_Var3 = ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        this_00 = ppStack_50;
        Generator::get_port((Generator *)local_68,(string *)generator);
        pp_Var1 = ((IRNode *)local_68)->_vptr_IRNode;
        if (*(int *)&(((Var *)((long)local_68 + 0x270))->super_IRNode)._vptr_IRNode == 0) {
          iVar2 = (*pp_Var1[0xe])();
          if (*(long *)(CONCAT44(extraout_var_00,iVar2) + 0x18) != 0) {
            pVVar4 = (VarException *)__cxa_allocate_exception(0x10);
            port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(generator->name)._M_dataplus._M_p;
            format_str_00.size_ = 0xdd;
            format_str_00.data_ = (char *)0x37;
            args_00.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.args_ = in_R9.args_;
            args_00.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)
                     &port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            fmt::v7::detail::vformat_abi_cxx11_
                      (&local_88,(detail *)"{0}.{1} is driving a net, but {0} is declared as a stub"
                       ,format_str_00,args_00);
            ports._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_68;
            __l_00._M_len = 2;
            __l_00._M_array = (iterator)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count;
            std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                      ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       &port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,__l_00,&local_31);
            VarException::VarException
                      (pVVar4,&local_88,
                       (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       &port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            __cxa_throw(pVVar4,&VarException::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        else {
          iVar2 = (*pp_Var1[0x10])();
          var = local_68;
          if (*(long *)(CONCAT44(extraout_var,iVar2) + 0x18) != 0) {
            pVVar4 = (VarException *)__cxa_allocate_exception(0x10);
            port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(generator->name)._M_dataplus._M_p;
            format_str.size_ = 0xdd;
            format_str.data_ = (char *)0x39;
            args.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.values_ = in_R9.values_;
            args.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)
                     &port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            fmt::v7::detail::vformat_abi_cxx11_
                      (&local_88,
                       (detail *)"{0}.{1} is driven by a net, but {0} is declared as a stub",
                       format_str,args);
            ports._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_68;
            __l._M_len = 2;
            __l._M_array = (iterator)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count;
            std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                      ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       &port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,__l,&local_31);
            VarException::VarException
                      (pVVar4,&local_88,
                       (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       &port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            __cxa_throw(pVVar4,&VarException::typeinfo,std::runtime_error::~runtime_error);
          }
          width = (*((IRNode *)local_68)->_vptr_IRNode[7])();
          Const::constant(0,width,false);
          Var::assign((Var *)&port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,(Var *)var);
          vars.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
          port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          ppStack_50 = (pointer)0x0;
          Generator::add_stmt(generator,
                              (shared_ptr<kratos::Stmt> *)
                              &vars.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (this_00 != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
          }
        }
        if (port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      } while (p_Var3 != (_Rb_tree_node_base *)&ports);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b0);
  }
  return;
}

Assistant:

void visit(Generator* generator) override {
        if (!generator->is_stub()) return;
        // to be a stub, there shouldn't be any extra variables
        if (generator->stmts_count() > 0) {
            throw ::runtime_error(::format("{0} is marked as a stub but contains statements"));
        }

        // has to be the exact same number of ports and vars, otherwise it means there are
        // some variables being declared
        auto vars = generator->get_vars();
        auto ports = generator->get_port_names();
        if (!vars.empty()) {
            throw GeneratorException(
                fmt::format("{0} is declared as stub but has declared variables", generator->name),
                {generator});
        }

        for (auto const& port_name : ports) {
            auto port = generator->get_port(port_name);
            if (port->port_direction() == PortDirection::In) {
                if (!port->sinks().empty())
                    throw VarException(
                        fmt::format("{0}.{1} is driving a net, but {0} is declared as a stub",
                                    generator->name, port_name),
                        {port.get(), generator});
            } else {
                if (!port->sources().empty())
                    throw VarException(
                        fmt::format("{0}.{1} is driven by a net, but {0} is declared as a stub",
                                    generator->name, port_name),
                        {port.get(), generator});
                generator->add_stmt(port->assign(constant(0, port->width())));
            }
        }
    }